

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

char * getcontent(xmlNode *attr)

{
  size_t sVar1;
  char *pcVar2;
  ushort **ppuVar3;
  bool bVar4;
  size_t len;
  char *sp;
  char *p;
  char *content;
  size_t size;
  xmlNode *chain;
  xmlNode *attr_local;
  
  size = (size_t)attr->children;
  content = (char *)0x0;
  for (; size != 0; size = *(size_t *)(size + 0x30)) {
    if (*(int *)(size + 8) == 3) {
      sVar1 = strlen(*(char **)(size + 0x50));
      content = content + sVar1;
    }
  }
  pcVar2 = (char *)malloc((size_t)(content + 1));
  sp = pcVar2;
  for (size = (size_t)attr->children; size != 0; size = *(size_t *)(size + 0x30)) {
    if (*(int *)(size + 8) == 3) {
      len = *(size_t *)(size + 0x50);
      if (sp == pcVar2) {
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)len] & 0x2000) != 0) {
          len = len + 1;
        }
      }
      sVar1 = strlen((char *)len);
      memcpy(sp,(void *)len,sVar1);
      sp = sp + sVar1;
    }
  }
  while( true ) {
    bVar4 = false;
    if (sp != pcVar2) {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)sp[-1]] & 0x2000) != 0;
    }
    if (!bVar4) break;
    sp = sp + -1;
  }
  *sp = '\0';
  return pcVar2;
}

Assistant:

static char *getcontent (xmlNode *attr) {
	xmlNode *chain = attr->children;
	size_t size = 0;
	char *content, *p;
	while (chain) {
		if (chain->type == XML_TEXT_NODE)
			size += strlen(chain->content);
		chain = chain->next;
	}
	p = content = malloc(size + 1);
	chain = attr->children;
	while (chain) {
		if (chain->type == XML_TEXT_NODE) {
			char* sp = chain->content;
			if(p == content) {
				while(isspace(*sp))
					++sp;
			}
			size_t len = strlen(sp);
			memcpy(p, sp, len);
			p += len;
		}
		chain = chain->next;
	}
	while(p != content && isspace(p[-1]))
		--p;
	*p = 0;
	return content;
}